

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImfDeepScanLineOutputFile.cpp
# Opt level: O2

void __thiscall Imf_3_4::DeepScanLineOutputFile::Data::~Data(Data *this)

{
  pointer ppLVar1;
  LineBuffer *this_00;
  pointer ppOVar2;
  size_t i;
  ulong uVar3;
  size_t i_1;
  
  uVar3 = 0;
  while( true ) {
    ppLVar1 = (this->lineBuffers).
              super__Vector_base<Imf_3_4::(anonymous_namespace)::LineBuffer_*,_std::allocator<Imf_3_4::(anonymous_namespace)::LineBuffer_*>_>
              ._M_impl.super__Vector_impl_data._M_start;
    if ((ulong)((long)(this->lineBuffers).
                      super__Vector_base<Imf_3_4::(anonymous_namespace)::LineBuffer_*,_std::allocator<Imf_3_4::(anonymous_namespace)::LineBuffer_*>_>
                      ._M_impl.super__Vector_impl_data._M_finish - (long)ppLVar1 >> 3) <= uVar3)
    break;
    this_00 = ppLVar1[uVar3];
    if (this_00 != (LineBuffer *)0x0) {
      if (this_00->compressor != (Compressor *)0x0) {
        (*this_00->compressor->_vptr_Compressor[1])();
      }
      if (this_00->sampleCountTableCompressor != (Compressor *)0x0) {
        (*this_00->sampleCountTableCompressor->_vptr_Compressor[1])();
      }
      IlmThread_3_4::Semaphore::~Semaphore(&this_00->_sem);
      std::__cxx11::string::~string((string *)&this_00->exception);
      Array<char>::~Array(&this_00->sampleCountTableBuffer);
      Array<char>::~Array(&this_00->consecutiveBuffer);
      Array<Imf_3_4::Array<char>_>::~Array(&this_00->buffer);
      operator_delete(this_00,200);
    }
    uVar3 = uVar3 + 1;
  }
  for (uVar3 = 0;
      ppOVar2 = (this->slices).
                super__Vector_base<Imf_3_4::(anonymous_namespace)::OutSliceInfo_*,_std::allocator<Imf_3_4::(anonymous_namespace)::OutSliceInfo_*>_>
                ._M_impl.super__Vector_impl_data._M_start,
      uVar3 < (ulong)((long)(this->slices).
                            super__Vector_base<Imf_3_4::(anonymous_namespace)::OutSliceInfo_*,_std::allocator<Imf_3_4::(anonymous_namespace)::OutSliceInfo_*>_>
                            ._M_impl.super__Vector_impl_data._M_finish - (long)ppOVar2 >> 3);
      uVar3 = uVar3 + 1) {
    operator_delete(ppOVar2[uVar3],0x38);
  }
  Array<unsigned_int>::~Array(&this->lineSampleCount);
  std::
  vector<Imf_3_4::(anonymous_namespace)::LineBuffer_*,_std::allocator<Imf_3_4::(anonymous_namespace)::LineBuffer_*>_>
  ::~vector(&this->lineBuffers);
  std::
  vector<Imf_3_4::(anonymous_namespace)::OutSliceInfo_*,_std::allocator<Imf_3_4::(anonymous_namespace)::OutSliceInfo_*>_>
  ::~vector(&this->slices);
  std::_Vector_base<unsigned_long,_std::allocator<unsigned_long>_>::~_Vector_base
            (&(this->bytesPerLine).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
            );
  std::_Vector_base<unsigned_long,_std::allocator<unsigned_long>_>::~_Vector_base
            (&(this->lineOffsets).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)
  ;
  std::
  _Rb_tree<Imf_3_4::Name,_std::pair<const_Imf_3_4::Name,_Imf_3_4::DeepSlice>,_std::_Select1st<std::pair<const_Imf_3_4::Name,_Imf_3_4::DeepSlice>_>,_std::less<Imf_3_4::Name>,_std::allocator<std::pair<const_Imf_3_4::Name,_Imf_3_4::DeepSlice>_>_>
  ::~_Rb_tree((_Rb_tree<Imf_3_4::Name,_std::pair<const_Imf_3_4::Name,_Imf_3_4::DeepSlice>,_std::_Select1st<std::pair<const_Imf_3_4::Name,_Imf_3_4::DeepSlice>_>,_std::less<Imf_3_4::Name>,_std::allocator<std::pair<const_Imf_3_4::Name,_Imf_3_4::DeepSlice>_>_>
               *)&this->frameBuffer);
  Header::~Header(&this->header);
  return;
}

Assistant:

DeepScanLineOutputFile::Data::~Data ()
{
    for (size_t i = 0; i < lineBuffers.size (); i++)
        if (lineBuffers[i] != 0) delete lineBuffers[i];

    for (size_t i = 0; i < slices.size (); i++)
        delete slices[i];
}